

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::fixup_implicit_builtin_block_names
          (CompilerGLSL *this,ExecutionModel model)

{
  uint uVar1;
  ID IVar2;
  BuiltIn BVar3;
  Variant *pVVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  SPIRVariable *var;
  SPIRType *pSVar9;
  size_type sVar10;
  Meta *pMVar11;
  size_t sVar12;
  Bitset flags;
  string local_c0;
  size_type local_a0;
  undefined1 local_98 [64];
  ID local_58;
  ExecutionModel local_54;
  size_t local_50;
  LoopLock local_48;
  ParsedIR *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  local_40 = &(this->super_Compiler).ir;
  local_54 = model;
  ParsedIR::create_loop_hard_lock(local_40);
  local_50 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (local_50 != 0) {
    local_38 = (this->super_Compiler).ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_50 = local_50 << 2;
    sVar12 = 0;
    do {
      uVar1 = *(uint *)((long)&local_38->id + sVar12);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(var->super_IVariant).field_0xc);
        bVar7 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar9->super_IVariant).self.id,
                           DecorationBlock);
        if (((var->storage | StorageClassUniform) == StorageClassOutput) && (bVar7)) {
          bVar8 = Compiler::is_builtin_variable(&this->super_Compiler,var);
          uVar5 = local_98._16_8_;
          if (bVar8) {
            if (local_54 == ExecutionModelMeshEXT) {
              Compiler::get_buffer_block_flags
                        ((Bitset *)local_98,&this->super_Compiler,
                         (VariableID)(var->super_IVariant).self.id);
              local_c0._M_dataplus._M_p._0_4_ = 0x1497;
              sVar10 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)(local_98 + 8),(key_type *)&local_c0);
              local_58.id = (var->super_IVariant).self.id;
              if (sVar10 == 0) {
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                local_a0 = 0x12;
                local_c0._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0)
                ;
                local_c0.field_2._M_allocated_capacity = local_a0;
                *(undefined8 *)local_c0._M_dataplus._M_p = 0x566873654d5f6c67;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 8) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 9) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 10) = 't';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xb) = 'i';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xc) = 'c';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xd) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xe) = 's';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xf) = 'E';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x10) = 'X';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x11) = 'T';
                local_c0._M_string_length = local_a0;
                local_c0._M_dataplus._M_p[local_a0] = '\0';
                Compiler::set_name(&this->super_Compiler,local_58,&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p);
                }
                IVar2.id = (pSVar9->super_IVariant).self.id;
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                local_a0 = 0x13;
                local_c0._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0)
                ;
                local_c0.field_2._M_allocated_capacity = local_a0;
                *(undefined8 *)local_c0._M_dataplus._M_p = 0x506873654d5f6c67;
                *(undefined8 *)((long)local_c0._M_dataplus._M_p + 8) = 0x7865747265567265;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xf) = 'x';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x10) = 'E';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x11) = 'X';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x12) = 'T';
                local_c0._M_string_length = local_a0;
                local_c0._M_dataplus._M_p[local_a0] = '\0';
                Compiler::set_name(&this->super_Compiler,IVar2,&local_c0);
              }
              else {
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                local_a0 = 0x14;
                local_c0._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0)
                ;
                local_c0.field_2._M_allocated_capacity = local_a0;
                *(undefined8 *)local_c0._M_dataplus._M_p = 0x506873654d5f6c67;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 8) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 9) = 'i';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 10) = 'm';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xb) = 'i';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xc) = 't';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xd) = 'i';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xe) = 'v';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xf) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x10) = 's';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x11) = 'E';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x12) = 'X';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x13) = 'T';
                local_c0._M_string_length = local_a0;
                local_c0._M_dataplus._M_p[local_a0] = '\0';
                Compiler::set_name(&this->super_Compiler,local_58,&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p);
                }
                IVar2.id = (pSVar9->super_IVariant).self.id;
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                local_a0 = 0x16;
                local_c0._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0)
                ;
                local_c0.field_2._M_allocated_capacity = local_a0;
                *(undefined8 *)local_c0._M_dataplus._M_p = 0x506873654d5f6c67;
                *(undefined8 *)((long)local_c0._M_dataplus._M_p + 8) = 0x74696d6972507265;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xe) = 'i';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0xf) = 't';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x10) = 'i';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x11) = 'v';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x12) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x13) = 'E';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x14) = 'X';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p + 0x15) = 'T';
                local_c0._M_string_length = local_a0;
                local_c0._M_dataplus._M_p[local_a0] = '\0';
                Compiler::set_name(&this->super_Compiler,IVar2,&local_c0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)(local_98 + 8));
            }
            else {
              if (var->storage == StorageClassInput) {
                local_98._0_8_ = local_98 + 0x10;
                local_98._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_98._16_6_ = 0x6e695f6c67;
                Compiler::set_name(&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                   (string *)local_98);
              }
              else {
                if (var->storage != StorageClassOutput) goto LAB_001ecb0b;
                local_98._0_8_ = local_98 + 0x10;
                local_98._16_6_ = 0x747500000000;
                local_98._16_4_ = 0x6f5f6c67;
                uVar6 = local_98._16_8_;
                local_98._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x6;
                local_98[0x17] = SUB81(uVar5,7);
                local_98._16_6_ = (undefined6)uVar6;
                local_98[0x16] = 0;
                Compiler::set_name(&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                   (string *)local_98);
              }
              if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
                operator_delete((void *)local_98._0_8_);
              }
            }
          }
        }
LAB_001ecb0b:
        if (!bVar7 && (var->storage == StorageClassOutput && local_54 == ExecutionModelMeshEXT)) {
          pMVar11 = ParsedIR::find_meta(local_40,(ID)(var->super_IVariant).self.id);
          if ((pMVar11 != (Meta *)0x0) && ((pMVar11->decoration).builtin == true)) {
            BVar3 = (pMVar11->decoration).builtin_type;
            if (BVar3 == BuiltInPrimitiveTriangleIndicesEXT) {
              IVar2.id = (var->super_IVariant).self.id;
              local_98._0_8_ = local_98 + 0x10;
              local_c0._M_dataplus._M_p = (pointer)0x1e;
              local_98._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_c0)
              ;
              local_98._16_8_ = local_c0._M_dataplus._M_p;
              builtin_strncpy((char *)local_98._0_8_,"gl_PrimitiveTriangleIndicesEXT",0x1e);
              local_98._8_8_ = local_c0._M_dataplus._M_p;
              *(char *)(local_98._0_8_ + (long)local_c0._M_dataplus._M_p) = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,(string *)local_98);
            }
            else if (BVar3 == BuiltInPrimitiveLineIndicesEXT) {
              IVar2.id = (var->super_IVariant).self.id;
              local_98._0_8_ = local_98 + 0x10;
              local_c0._M_dataplus._M_p = (pointer)0x1a;
              local_98._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_c0)
              ;
              local_98._16_8_ = local_c0._M_dataplus._M_p;
              builtin_strncpy((char *)local_98._0_8_,"gl_PrimitiveLineIndicesEXT",0x1a);
              local_98._8_8_ = local_c0._M_dataplus._M_p;
              *(char *)(local_98._0_8_ + (long)local_c0._M_dataplus._M_p) = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,(string *)local_98);
            }
            else {
              if (BVar3 != BuiltInPrimitivePointIndicesEXT) goto LAB_001eccc7;
              IVar2.id = (var->super_IVariant).self.id;
              local_98._0_8_ = local_98 + 0x10;
              local_c0._M_dataplus._M_p = (pointer)0x1b;
              local_98._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_c0)
              ;
              local_98._16_8_ = local_c0._M_dataplus._M_p;
              builtin_strncpy((char *)local_98._0_8_,"gl_PrimitivePointIndicesEXT",0x1b);
              local_98._8_8_ = local_c0._M_dataplus._M_p;
              *(char *)(local_98._0_8_ + (long)local_c0._M_dataplus._M_p) = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,(string *)local_98);
            }
            if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
              operator_delete((void *)local_98._0_8_);
            }
          }
        }
      }
LAB_001eccc7:
      sVar12 = sVar12 + 4;
    } while (local_50 != sVar12);
  }
  ParsedIR::LoopLock::~LoopLock(&local_48);
  return;
}

Assistant:

void CompilerGLSL::fixup_implicit_builtin_block_names(ExecutionModel model)
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if ((var.storage == StorageClassOutput || var.storage == StorageClassInput) && block &&
		    is_builtin_variable(var))
		{
			if (model != ExecutionModelMeshEXT)
			{
				// Make sure the array has a supported name in the code.
				if (var.storage == StorageClassOutput)
					set_name(var.self, "gl_out");
				else if (var.storage == StorageClassInput)
					set_name(var.self, "gl_in");
			}
			else
			{
				auto flags = get_buffer_block_flags(var.self);
				if (flags.get(DecorationPerPrimitiveEXT))
				{
					set_name(var.self, "gl_MeshPrimitivesEXT");
					set_name(type.self, "gl_MeshPerPrimitiveEXT");
				}
				else
				{
					set_name(var.self, "gl_MeshVerticesEXT");
					set_name(type.self, "gl_MeshPerVertexEXT");
				}
			}
		}

		if (model == ExecutionModelMeshEXT && var.storage == StorageClassOutput && !block)
		{
			auto *m = ir.find_meta(var.self);
			if (m && m->decoration.builtin)
			{
				auto builtin_type = m->decoration.builtin_type;
				if (builtin_type == BuiltInPrimitivePointIndicesEXT)
					set_name(var.self, "gl_PrimitivePointIndicesEXT");
				else if (builtin_type == BuiltInPrimitiveLineIndicesEXT)
					set_name(var.self, "gl_PrimitiveLineIndicesEXT");
				else if (builtin_type == BuiltInPrimitiveTriangleIndicesEXT)
					set_name(var.self, "gl_PrimitiveTriangleIndicesEXT");
			}
		}
	});
}